

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O3

void maybe_free_watcher_list(watcher_list *w,uv_loop_t *loop)

{
  int iVar1;
  watcher_root *head;
  uv_loop_t *loop_local;
  watcher_list *w_local;
  
  if (w->iterating == 0) {
    iVar1 = uv__queue_empty(&w->watchers);
    if (iVar1 != 0) {
      head = uv__inotify_watchers(loop);
      watcher_root_RB_REMOVE(head,w);
      inotify_rm_watch(loop->inotify_fd,w->wd);
      uv__free(w);
    }
  }
  return;
}

Assistant:

static void maybe_free_watcher_list(struct watcher_list* w, uv_loop_t* loop) {
  /* if the watcher_list->watchers is being iterated over, we can't free it. */
  if ((!w->iterating) && uv__queue_empty(&w->watchers)) {
    /* No watchers left for this path. Clean up. */
    RB_REMOVE(watcher_root, uv__inotify_watchers(loop), w);
    inotify_rm_watch(loop->inotify_fd, w->wd);
    uv__free(w);
  }
}